

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_unit.cc
# Opt level: O2

void __thiscall pstack::Dwarf::Unit::load(Unit *this)

{
  Object *this_00;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long extraout_RDX;
  pointer pcVar2;
  element_type *peVar3;
  element_type *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  Elf64_Addr *local_50;
  undefined8 *local_48;
  Elf64_Addr local_40;
  uintmax_t code;
  
  this_00 = (this->dwarf->elf).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,".debug_abbrev",(allocator<char> *)&local_40);
  Elf::Object::getDebugSection(this_00,(string *)local_78,0);
  std::__cxx11::string::~string((string *)local_78);
  Elf::Section::io((Section *)&local_88);
  pcVar2 = (pointer)this->abbrevOffset;
  local_78._0_8_ = pcVar2;
  iVar1 = (*local_88->_vptr_Reader[8])();
  peVar3 = local_88;
  local_78._8_8_ = CONCAT44(extraout_var,iVar1);
  code = (uintmax_t)(local_78 + 0x18);
  local_78._16_8_ = local_88;
  local_60._0_8_ = _Stack_80._M_pi;
  local_88 = (element_type *)0x0;
  _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60._8_4_ = 8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_80);
  while( true ) {
    iVar1 = (*peVar3->_vptr_Reader[3])(peVar3,pcVar2);
    local_40 = CONCAT44(extraout_var_00,iVar1);
    local_78._0_8_ = local_78._0_8_ + extraout_RDX;
    if (local_40 == 0) break;
    local_50 = &local_40;
    local_48 = (undefined8 *)local_78;
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,pstack::Dwarf::Abbreviation>,std::allocator<std::pair<unsigned_long_const,pstack::Dwarf::Abbreviation>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::piecewise_construct_t_const&,std::tuple<unsigned_long&>,std::tuple<pstack::Dwarf::DWARFReader&>>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,pstack::Dwarf::Abbreviation>,std::allocator<std::pair<unsigned_long_const,pstack::Dwarf::Abbreviation>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->abbreviations,&std::piecewise_construct,&local_50,&local_48);
    pcVar2 = (pointer)local_78._0_8_;
    peVar3 = (element_type *)local_78._16_8_;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 0x18));
  return;
}

Assistant:

void
Unit::load()
{
    auto &abbrev { dwarf->elf->getDebugSection(".debug_abbrev", SHT_NULL) };
    DWARFReader abbR(abbrev.io(), abbrevOffset);
    uintmax_t code;
    while ((code = abbR.getuleb128()) != 0)
        abbreviations.emplace(std::piecewise_construct,
                std::forward_as_tuple(code),
                std::forward_as_tuple(abbR));
}